

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O3

bool __thiscall
spvtools::val::ValidationState_t::GetPointerTypeInfo
          (ValidationState_t *this,uint32_t id,uint32_t *data_type,StorageClass *storage_class)

{
  long *plVar1;
  long lVar2;
  bool bVar3;
  uint32_t uVar4;
  const_iterator cVar5;
  key_type_conflict local_14;
  
  *storage_class = Max;
  if (id == 0) {
LAB_00305930:
    bVar3 = false;
  }
  else {
    cVar5 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->all_definitions_)._M_h,&local_14);
    if ((cVar5.
         super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
         ._M_cur == (__node_type *)0x0) ||
       (plVar1 = *(long **)((long)cVar5.
                                  super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
                                  ._M_cur + 0x10), plVar1 == (long *)0x0)) {
      __assert_fail("inst",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp"
                    ,0x4b0,
                    "bool spvtools::val::ValidationState_t::GetPointerTypeInfo(uint32_t, uint32_t *, spv::StorageClass *) const"
                   );
    }
    if (*(short *)((long)plVar1 + 0x3a) == 0x20) {
      lVar2 = *plVar1;
      *storage_class = *(StorageClass *)(lVar2 + 8);
      uVar4 = *(uint32_t *)(lVar2 + 0xc);
    }
    else {
      if (*(short *)((long)plVar1 + 0x3a) != 0x1141) goto LAB_00305930;
      *storage_class = *(StorageClass *)(*plVar1 + 8);
      uVar4 = 0;
    }
    *data_type = uVar4;
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool ValidationState_t::GetPointerTypeInfo(
    uint32_t id, uint32_t* data_type, spv::StorageClass* storage_class) const {
  *storage_class = spv::StorageClass::Max;
  if (!id) return false;

  const Instruction* inst = FindDef(id);
  assert(inst);
  if (inst->opcode() == spv::Op::OpTypeUntypedPointerKHR) {
    *storage_class = spv::StorageClass(inst->word(2));
    *data_type = 0;
    return true;
  }

  if (inst->opcode() != spv::Op::OpTypePointer) return false;

  *storage_class = spv::StorageClass(inst->word(2));
  *data_type = inst->word(3);
  return true;
}